

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::
     RenderLineSegments<ImPlot::GetterYs<unsigned_int>,ImPlot::GetterYRef,ImPlot::TransformerLogLog>
               (GetterYs<unsigned_int> *getter1,GetterYRef *getter2,TransformerLogLog *transformer,
               ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  uint uVar8;
  ImPlotPlot *pIVar9;
  double dVar10;
  double dVar11;
  ImPlotContext *pIVar12;
  ImPlotContext *pIVar13;
  int iVar14;
  float fVar15;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_80;
  int local_74;
  ImDrawList *local_70;
  double local_68;
  ImPlotContext *local_60;
  undefined1 local_58 [8];
  GetterYRef *local_50;
  TransformerLogLog *local_48;
  int local_40;
  ImU32 local_3c;
  float local_38;
  
  local_70 = DrawList;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    local_40 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_40 = getter1->Count;
    }
    local_58 = (undefined1  [8])getter1;
    local_50 = getter2;
    local_48 = transformer;
    local_3c = col;
    local_38 = line_weight;
    RenderPrimitives<ImPlot::LineSegmentsRenderer<ImPlot::GetterYs<unsigned_int>,ImPlot::GetterYRef,ImPlot::TransformerLogLog>>
              ((LineSegmentsRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
                *)local_58,DrawList,&GImPlot->CurrentPlot->PlotRect);
  }
  else {
    local_60 = GImPlot;
    local_74 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_74 = getter1->Count;
    }
    if (0 < local_74) {
      iVar14 = 0;
      local_68 = 0.0;
      do {
        pIVar12 = GImPlot;
        iVar7 = getter1->Count;
        uVar8 = *(uint *)((long)getter1->Ys +
                         (long)(((getter1->Offset + iVar14) % iVar7 + iVar7) % iVar7) *
                         (long)getter1->Stride);
        dVar10 = log10((getter1->XScale * local_68 + getter1->X0) /
                       (GImPlot->CurrentPlot->XAxis).Range.Min);
        dVar3 = pIVar12->LogDenX;
        pIVar9 = pIVar12->CurrentPlot;
        dVar4 = (pIVar9->XAxis).Range.Min;
        dVar5 = (pIVar9->XAxis).Range.Max;
        dVar11 = log10((double)uVar8 / pIVar9->YAxis[transformer->YAxis].Range.Min);
        pIVar13 = GImPlot;
        iVar7 = transformer->YAxis;
        pIVar9 = pIVar12->CurrentPlot;
        dVar6 = pIVar9->YAxis[iVar7].Range.Min;
        local_58._0_4_ =
             (undefined4)
             ((((double)(float)(dVar10 / dVar3) * (dVar5 - dVar4) + dVar4) -
              (pIVar9->XAxis).Range.Min) * pIVar12->Mx + (double)pIVar12->PixelRange[iVar7].Min.x);
        local_58._4_4_ =
             (float)((((double)(float)(dVar11 / pIVar12->LogDenY[iVar7]) *
                       (pIVar9->YAxis[iVar7].Range.Max - dVar6) + dVar6) - dVar6) *
                     pIVar12->My[iVar7] + (double)pIVar12->PixelRange[iVar7].Min.y);
        dVar3 = getter2->YRef;
        dVar10 = log10((getter2->XScale * local_68 + getter2->X0) /
                       (GImPlot->CurrentPlot->XAxis).Range.Min);
        dVar4 = pIVar13->LogDenX;
        pIVar9 = pIVar13->CurrentPlot;
        dVar5 = (pIVar9->XAxis).Range.Min;
        dVar6 = (pIVar9->XAxis).Range.Max;
        dVar11 = log10(dVar3 / pIVar9->YAxis[transformer->YAxis].Range.Min);
        iVar7 = transformer->YAxis;
        pIVar9 = pIVar13->CurrentPlot;
        dVar3 = pIVar9->YAxis[iVar7].Range.Min;
        local_80.x = (float)((((double)(float)(dVar10 / dVar4) * (dVar6 - dVar5) + dVar5) -
                             (pIVar9->XAxis).Range.Min) * pIVar13->Mx +
                            (double)pIVar13->PixelRange[iVar7].Min.x);
        fVar15 = (float)((((double)(float)(dVar11 / pIVar13->LogDenY[iVar7]) *
                           (pIVar9->YAxis[iVar7].Range.Max - dVar3) + dVar3) - dVar3) *
                         pIVar13->My[iVar7] + (double)pIVar13->PixelRange[iVar7].Min.y);
        local_80.y = fVar15;
        pIVar9 = local_60->CurrentPlot;
        fVar2 = (float)local_58._4_4_;
        if (fVar15 <= (float)local_58._4_4_) {
          fVar2 = fVar15;
        }
        if ((fVar2 < (pIVar9->PlotRect).Max.y) &&
           (fVar2 = (float)(~-(uint)(fVar15 <= (float)local_58._4_4_) & (uint)fVar15 |
                           local_58._4_4_ & -(uint)(fVar15 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar9->PlotRect).Min.y, *pfVar1 <= fVar2 && fVar2 != *pfVar1)) {
          fVar2 = (float)local_58._0_4_;
          if (local_80.x <= (float)local_58._0_4_) {
            fVar2 = local_80.x;
          }
          if ((fVar2 < (pIVar9->PlotRect).Max.x) &&
             (fVar2 = (float)(~-(uint)(local_80.x <= (float)local_58._0_4_) & (uint)local_80.x |
                             local_58._0_4_ & -(uint)(local_80.x <= (float)local_58._0_4_)),
             (pIVar9->PlotRect).Min.x <= fVar2 && fVar2 != (pIVar9->PlotRect).Min.x)) {
            ImDrawList::AddLine(local_70,(ImVec2 *)local_58,&local_80,col,line_weight);
          }
        }
        local_68 = local_68 + 1.0;
        iVar14 = iVar14 + 1;
      } while (local_74 != iVar14);
    }
  }
  return;
}

Assistant:

inline void RenderLineSegments(const Getter1& getter1, const Getter2& getter2, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        int I = ImMin(getter1.Count, getter2.Count);
        for (int i = 0; i < I; ++i) {
            ImVec2 p1 = transformer(getter1(i));
            ImVec2 p2 = transformer(getter2(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
        }
    }
    else {
        RenderPrimitives(LineSegmentsRenderer<Getter1,Getter2,Transformer>(getter1, getter2, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}